

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O1

void __thiscall amrex::FabArrayBase::PolarB::define(PolarB *this,FabArrayBase *fa)

{
  pointer *ppCVar1;
  int *piVar2;
  int iVar3;
  undefined8 *puVar4;
  uint uVar5;
  map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
  *pmVar6;
  iterator iVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  long lVar10;
  int iVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  int iVar14;
  mapped_type *this_00;
  vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>> *this_01;
  _Rb_tree_node_base *p_Var15;
  int n_1;
  int iVar16;
  Box *box;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int n;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  bool bVar26;
  PolarFn convert;
  int dst_owner;
  Box dst_box;
  Box src_box;
  PolarFn2 convert_corner;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  Box bxsnd;
  Box gbx;
  CopyComTag cct;
  Array<Box,_8> domain_src;
  PolarFn local_340;
  ulong local_338;
  Box *local_330;
  int local_324;
  BoxArray *local_320;
  Box local_318;
  Box local_2f8;
  ulong local_2d0;
  ulong local_2c8;
  FabArrayBase *local_2c0;
  int local_2b4;
  PolarFn2 local_2b0;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> local_2a8;
  Box local_290;
  Box local_274;
  CopyComTag local_258;
  ulong local_210;
  uint local_204;
  uint local_200;
  uint local_1fc;
  ulong local_1f8;
  undefined8 local_1f0;
  uint local_1e8;
  undefined8 local_1e4;
  uint local_1dc [2];
  ulong local_1d4;
  uint local_1cc;
  undefined8 local_1c8;
  uint local_1c0;
  undefined4 local_1bc;
  undefined8 local_1b8;
  uint local_1b0;
  undefined8 local_1ac;
  uint local_1a4;
  undefined4 local_1a0;
  ulong local_19c;
  uint local_194;
  undefined8 local_190;
  uint local_188;
  undefined4 local_184;
  Box local_180;
  Box BStack_164;
  Box BStack_148;
  Box BStack_12c;
  uint local_110 [5];
  ulong local_fc;
  uint local_f4;
  int local_f0;
  uint local_ec;
  uint local_e8;
  int local_e4;
  ulong local_e0;
  uint local_d8;
  int local_d4;
  uint local_d0;
  uint local_cc;
  int local_c8;
  ulong local_c4;
  uint local_bc;
  int local_b8;
  uint local_b4;
  uint local_b0;
  int local_ac;
  ulong local_a8;
  Box local_a0;
  Box local_84;
  Box local_68;
  Box local_4c;
  
  local_2b4 = *(int *)(ParallelContext::frames + 0xc);
  local_2a8.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e4 = (this->m_domain).bigend.vect[1];
  local_110[1] = (this->m_domain).smallend.vect[1];
  iVar19 = local_e4 - local_110[1];
  local_340.Ly = iVar19 + 1;
  local_f0 = (iVar19 - (local_340.Ly >> 0x1f)) + 1 >> 1;
  uVar23 = (this->m_domain).smallend.vect[0];
  local_2d0 = (ulong)uVar23;
  iVar14 = (this->m_ngrow).vect[0];
  local_110[0] = uVar23 - iVar14;
  uVar22 = (this->m_domain).btype.itype;
  local_a0.smallend.vect[2] = (this->m_ngrow).vect[2];
  local_1e8 = (this->m_domain).smallend.vect[2] - local_a0.smallend.vect[2];
  local_a0.bigend.vect[2] = (this->m_domain).bigend.vect[2] + local_a0.smallend.vect[2];
  local_fc = CONCAT44(uVar22,local_a0.bigend.vect[2]) & 0xfffffffeffffffff;
  uVar5 = (this->m_ngrow).vect[1];
  local_210 = (ulong)uVar5;
  iVar20 = (this->m_domain).bigend.vect[0];
  local_2c8 = CONCAT44(local_2c8._4_4_,local_110[0]);
  local_110[3] = uVar23 - 1;
  local_110[4] = local_f0 + -1;
  local_d8 = (iVar20 - (uVar22 & 1)) + 1;
  local_cc = iVar14 + -1 + local_d8;
  local_a0.smallend.vect[0] = -iVar14;
  local_a0.smallend.vect[1] = -uVar5;
  local_a0.smallend.vect[2] = -local_a0.smallend.vect[2];
  local_a0.bigend.vect[0] = -1;
  local_a0.bigend.vect[1] = -1;
  local_a0.btype.itype = 0;
  local_84.btype.itype = 0;
  local_84.bigend.vect[1] = uVar5 + iVar19;
  local_84.bigend.vect[0] = -1;
  local_340.Lx = (iVar20 + 1) - uVar23;
  local_68.btype.itype = 0;
  local_68.bigend.vect[0] = iVar14 + -1 + local_340.Lx;
  local_68.bigend.vect[1] = -1;
  local_4c.btype.itype = 0;
  local_4c.bigend.vect[1] = uVar5 + iVar19;
  local_4c.bigend.vect[0] = local_68.bigend.vect[0];
  local_338 = (ulong)((long)(fa->indexArray).super_vector<int,_std::allocator<int>_>.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(fa->indexArray).super_vector<int,_std::allocator<int>_>.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2;
  iVar19 = -local_f0;
  iVar16 = local_340.Lx / 2;
  iVar20 = local_340.Lx * 2;
  iVar18 = 0;
  if (iVar16 < (int)uVar23) {
    iVar18 = iVar20;
  }
  iVar11 = iVar19;
  if ((int)local_110[1] < local_f0) {
    iVar11 = local_f0;
  }
  local_1f0 = CONCAT44(iVar11 + local_110[1],iVar18 - uVar23);
  iVar18 = iVar20;
  if ((int)local_110[0] < iVar16) {
    iVar18 = 0;
  }
  iVar3 = local_f0 * 2 + -1;
  local_1e4 = CONCAT44(iVar3,iVar18 + ~local_110[0]);
  local_1dc[0] = (uint)local_fc;
  iVar17 = iVar20;
  if ((int)local_110[3] < iVar16) {
    iVar17 = 0;
  }
  local_1d4 = (ulong)(iVar17 + ~local_110[3]);
  iVar17 = iVar19;
  if (local_e4 < local_f0) {
    iVar17 = local_f0;
  }
  local_1c8 = CONCAT44(iVar17 + local_e4,iVar18 + ~local_110[0]);
  local_1dc[1] = 0;
  local_1c0 = (uint)local_fc;
  iVar18 = 0;
  if (iVar16 < (int)(iVar14 + local_d8)) {
    iVar18 = iVar20;
  }
  local_1b8 = CONCAT44(iVar11 + local_110[1],iVar18 - (iVar14 + local_d8));
  iVar14 = iVar20;
  if ((int)local_d8 < iVar16) {
    iVar14 = 0;
  }
  local_1bc = 0;
  local_1ac = CONCAT44(iVar3,iVar14 + ~local_d8);
  local_1a4 = (uint)local_fc;
  if ((int)local_cc < iVar16) {
    iVar20 = 0;
  }
  local_19c = (ulong)(iVar20 + ~local_cc);
  if (local_e4 < local_f0) {
    iVar19 = local_f0;
  }
  local_320 = &fa->boxarray;
  local_190 = CONCAT44(iVar19 + local_e4,iVar14 + ~local_d8);
  local_330 = &local_84;
  local_1a0 = 0;
  local_188 = (uint)local_fc;
  local_184 = 0;
  local_2c0 = fa;
  local_2b0.Lx = local_340.Lx;
  local_2b0.Ly = local_340.Ly;
  local_1cc = local_1e8;
  local_1b0 = local_1e8;
  local_194 = local_1e8;
  local_110[2] = local_1e8;
  local_f4 = local_110[0];
  local_ec = local_1e8;
  local_e8 = local_110[3];
  local_e0 = local_fc;
  local_d4 = local_110[1];
  local_d0 = local_1e8;
  local_c8 = local_110[4];
  local_c4 = local_fc;
  local_bc = local_d8;
  local_b8 = local_f0;
  local_b4 = local_1e8;
  local_b0 = local_cc;
  local_ac = local_e4;
  local_a8 = local_fc;
  local_84.smallend.vect[0] = local_a0.smallend.vect[0];
  local_84.smallend.vect[1] = local_340.Ly;
  local_84.smallend.vect[2] = local_a0.smallend.vect[2];
  local_84.bigend.vect[2] = local_a0.bigend.vect[2];
  local_68.smallend.vect[0] = local_340.Lx;
  local_68.smallend.vect[1] = local_a0.smallend.vect[1];
  local_68.smallend.vect[2] = local_a0.smallend.vect[2];
  local_68.bigend.vect[2] = local_a0.bigend.vect[2];
  local_4c.smallend.vect[0] = local_340.Lx;
  local_4c.smallend.vect[1] = local_340.Ly;
  local_4c.smallend.vect[2] = local_a0.smallend.vect[2];
  local_4c.bigend.vect[2] = local_a0.bigend.vect[2];
  NonLocalBC::PolarFn2::operator()(&local_180,&local_2b0,&local_a0);
  NonLocalBC::PolarFn2::operator()(&BStack_164,&local_2b0,local_330);
  NonLocalBC::PolarFn2::operator()(&BStack_148,&local_2b0,&local_68);
  NonLocalBC::PolarFn2::operator()(&BStack_12c,&local_2b0,&local_4c);
  if (0 < (int)(uint)local_338) {
    local_330 = (Box *)&this->m_ngrow;
    pmVar6 = (this->super_CommMetaData).m_SndTags._M_t.
             super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
             .
             super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
             ._M_head_impl;
    local_2d0 = (ulong)((uint)local_338 & 0x7fffffff);
    uVar21 = 0;
    do {
      iVar14 = (local_2c0->indexArray).super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar21];
      local_2c8 = uVar21;
      BATransformer::operator()
                (&local_274,&local_320->m_bat,
                 (Box *)((long)iVar14 * 0x1c +
                        *(long *)&(((local_2c0->boxarray).m_ref.
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      if (local_274.smallend.vect[2] == (this->m_domain).smallend.vect[2]) {
        local_274.smallend.vect[2] = local_274.smallend.vect[2] - (this->m_ngrow).vect[2];
      }
      if (local_274.bigend.vect[2] == (this->m_domain).bigend.vect[2]) {
        local_274.bigend.vect[2] = local_274.bigend.vect[2] + (this->m_ngrow).vect[2];
      }
      uVar21 = 0;
      do {
        local_2f8.smallend.vect[0] = *(uint *)((long)&local_1f0 + uVar21 * 0x1c);
        local_2f8.smallend.vect[1] = *(uint *)((long)&local_1f0 + uVar21 * 0x1c + 4);
        if (local_2f8.smallend.vect[0] < local_274.smallend.vect[0]) {
          local_2f8.smallend.vect[0] = local_274.smallend.vect[0];
        }
        if (local_2f8.smallend.vect[1] < local_274.smallend.vect[1]) {
          local_2f8.smallend.vect[1] = local_274.smallend.vect[1];
        }
        local_2f8.smallend.vect[2] = (&local_1e8)[uVar21 * 7];
        if ((int)(&local_1e8)[uVar21 * 7] < local_274.smallend.vect[2]) {
          local_2f8.smallend.vect[2] = local_274.smallend.vect[2];
        }
        local_2f8.bigend.vect[0] = local_1dc[uVar21 * 7 + -2];
        if (local_274.bigend.vect[0] < (int)local_1dc[uVar21 * 7 + -2]) {
          local_2f8.bigend.vect[0] = local_274.bigend.vect[0];
        }
        local_2f8.bigend.vect[1] = local_1dc[uVar21 * 7 + -1];
        if (local_274.bigend.vect[1] < (int)local_1dc[uVar21 * 7 + -1]) {
          local_2f8.bigend.vect[1] = local_274.bigend.vect[1];
        }
        local_2f8.bigend.vect[2] = local_1dc[uVar21 * 7];
        if (local_274.bigend.vect[2] < (int)local_1dc[uVar21 * 7]) {
          local_2f8.bigend.vect[2] = local_274.bigend.vect[2];
        }
        local_2f8.btype.itype = local_274.btype.itype;
        if ((((local_2f8.smallend.vect[0] <= local_2f8.bigend.vect[0]) &&
             (local_2f8.smallend.vect[1] <= local_2f8.bigend.vect[1])) &&
            (local_2f8.smallend.vect[2] <= local_2f8.bigend.vect[2])) && (local_274.btype.itype < 8)
           ) {
          if (uVar21 < 4) {
            iVar20 = local_340.Lx * 2;
            iVar19 = iVar20;
            if (local_2f8.bigend.vect[0] < local_340.Lx / 2) {
              iVar19 = 0;
            }
            local_318.smallend.vect[0] = iVar19 + ~local_2f8.bigend.vect[0];
            iVar18 = local_340.Ly / 2;
            iVar19 = -iVar18;
            if (local_2f8.smallend.vect[1] < iVar18) {
              iVar19 = iVar18;
            }
            local_318.smallend.vect[1] = iVar19 + local_2f8.smallend.vect[1];
            if (local_2f8.smallend.vect[0] < local_340.Lx / 2) {
              iVar20 = 0;
            }
            local_318.bigend.vect[0] = iVar20 + ~local_2f8.smallend.vect[0];
            local_318.bigend.vect[1] = -iVar18;
            if (local_2f8.bigend.vect[1] < iVar18) {
              local_318.bigend.vect[1] = iVar18;
            }
            local_318.bigend.vect[1] = local_318.bigend.vect[1] + local_2f8.bigend.vect[1];
            local_318.btype.itype = 0;
            local_318.bigend.vect[2] = local_2f8.bigend.vect[2];
            local_318.smallend.vect[2] = local_2f8.smallend.vect[2];
          }
          else {
            NonLocalBC::PolarFn2::operator()(&local_318,&local_2b0,&local_2f8);
          }
          BoxArray::intersections(local_320,&local_318,&local_2a8,false,&local_330->smallend);
          uVar23 = (uint)((ulong)((long)local_2a8.
                                        super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2a8.
                                       super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 5);
          if (0 < (int)uVar23) {
            uVar24 = (ulong)(uVar23 & 0x7fffffff);
            lVar25 = 4;
            do {
              iVar20 = *(int *)((long)((local_2a8.
                                        super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->second).smallend
                                      .vect + lVar25 + -8);
              local_324 = *(int *)(*(long *)&(((local_2c0->distributionMap).m_ref.
                                               super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr)->m_pmap).
                                             super_vector<int,_std::allocator<int>_>.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                  (long)iVar20 * 4);
              if (local_324 != local_2b4) {
                box = (Box *)((long)((local_2a8.
                                      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->second).smallend.
                                    vect + lVar25 + -4);
                if (uVar21 < 4) {
                  NonLocalBC::PolarFn::operator()(&local_290,&local_340,box);
                }
                else {
                  NonLocalBC::PolarFn2::operator()(&local_290,&local_2b0,box);
                }
                this_00 = std::
                          map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                          ::operator[](pmVar6,&local_324);
                local_258.dbox.smallend.vect._0_8_ = *(undefined8 *)(box->smallend).vect;
                uVar12 = *(undefined8 *)((box->smallend).vect + 2);
                uVar13 = *(undefined8 *)((box->bigend).vect + 2);
                local_258.dbox.bigend.vect[1] =
                     (int)((ulong)*(undefined8 *)(box->bigend).vect >> 0x20);
                local_258.dbox.bigend.vect[2] = (int)uVar13;
                local_258.dbox.btype.itype = (uint)((ulong)uVar13 >> 0x20);
                local_258.dbox.smallend.vect[2] = (int)uVar12;
                local_258.dbox.bigend.vect[0] = (int)((ulong)uVar12 >> 0x20);
                local_258.sbox._20_8_ = CONCAT44(local_290.btype.itype,local_290.bigend.vect[2]);
                local_258.sbox.bigend.vect[1] = local_290.bigend.vect[1];
                local_258.sbox.smallend.vect[0] = local_290.smallend.vect[0];
                local_258.sbox.smallend.vect[1] = local_290.smallend.vect[1];
                local_258.sbox.smallend.vect[2] = local_290.smallend.vect[2];
                local_258.sbox.bigend.vect[0] = local_290.bigend.vect[0];
                iVar7._M_current =
                     (this_00->
                     super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
                local_258.dstIndex = iVar20;
                local_258.srcIndex = iVar14;
                if (iVar7._M_current ==
                    (this_00->
                    super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                  ::_M_realloc_insert<amrex::FabArrayBase::CopyComTag>(this_00,iVar7,&local_258);
                }
                else {
                  *(undefined8 *)(((iVar7._M_current)->sbox).bigend.vect + 2) =
                       local_258.sbox._20_8_;
                  (iVar7._M_current)->dstIndex = iVar20;
                  (iVar7._M_current)->srcIndex = iVar14;
                  *(ulong *)(((iVar7._M_current)->sbox).smallend.vect + 1) =
                       CONCAT44(local_290.smallend.vect[2],local_258.sbox.smallend.vect[1]);
                  *(ulong *)((iVar7._M_current)->sbox).bigend.vect =
                       CONCAT44(local_290.bigend.vect[1],local_290.bigend.vect[0]);
                  *(ulong *)(((iVar7._M_current)->dbox).bigend.vect + 1) =
                       CONCAT44(local_258.dbox.bigend.vect[2],local_258.dbox.bigend.vect[1]);
                  *(ulong *)&((iVar7._M_current)->dbox).btype =
                       CONCAT44(local_258.sbox.smallend.vect[0],local_258.dbox.btype.itype);
                  *(undefined8 *)((iVar7._M_current)->dbox).smallend.vect =
                       local_258.dbox.smallend.vect._0_8_;
                  *(undefined8 *)(((iVar7._M_current)->dbox).smallend.vect + 2) = uVar12;
                  ppCVar1 = &(this_00->
                             super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                             )._M_impl.super__Vector_impl_data._M_finish;
                  *ppCVar1 = *ppCVar1 + 1;
                }
              }
              lVar25 = lVar25 + 0x20;
              uVar24 = uVar24 - 1;
            } while (uVar24 != 0);
          }
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 != 8);
      uVar21 = local_2c8 + 1;
    } while (uVar21 != local_2d0);
  }
  if (0 < (int)(uint)local_338) {
    pmVar6 = (this->super_CommMetaData).m_RcvTags._M_t.
             super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
             .
             super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
             ._M_head_impl;
    local_338 = (ulong)((uint)local_338 & 0x7fffffff);
    uVar21 = 0;
    do {
      iVar14 = (local_2c0->indexArray).super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar21];
      local_1f8 = uVar21;
      BATransformer::operator()
                (&local_258.dbox,&local_320->m_bat,
                 (Box *)((long)iVar14 * 0x1c +
                        *(long *)&(((local_2c0->boxarray).m_ref.
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      local_2d0 = CONCAT44(local_2d0._4_4_,local_258.dbox.btype.itype);
      iVar20 = (this->m_ngrow).vect[0];
      iVar19 = (this->m_ngrow).vect[1];
      uVar23 = local_258.dbox.smallend.vect[0] - iVar20;
      local_330 = (Box *)CONCAT44(local_330._4_4_,local_258.dbox.smallend.vect[1] - iVar19);
      iVar18 = (this->m_ngrow).vect[2];
      local_210 = CONCAT44(local_210._4_4_,iVar20 + local_258.dbox.bigend.vect[0]);
      local_1fc = iVar19 + local_258.dbox.bigend.vect[1];
      local_2c8 = CONCAT44(local_2c8._4_4_,local_258.dbox.smallend.vect[2] - iVar18);
      local_200 = iVar18 + local_258.dbox.bigend.vect[2];
      uVar21 = 0;
      local_204 = uVar23;
      do {
        local_274.smallend.vect[0] = local_110[uVar21 * 7];
        if ((int)local_110[uVar21 * 7] < (int)uVar23) {
          local_274.smallend.vect[0] = uVar23;
        }
        local_274.smallend.vect[1] = local_110[uVar21 * 7 + 1];
        if ((int)local_110[uVar21 * 7 + 1] < (int)(uint)local_330) {
          local_274.smallend.vect[1] = (uint)local_330;
        }
        local_274.smallend.vect[2] = local_110[uVar21 * 7 + 2];
        if ((int)local_110[uVar21 * 7 + 2] < (int)(uint)local_2c8) {
          local_274.smallend.vect[2] = (uint)local_2c8;
        }
        local_274.bigend.vect[0] = local_110[uVar21 * 7 + 3];
        if ((int)(uint)local_210 < (int)local_110[uVar21 * 7 + 3]) {
          local_274.bigend.vect[0] = (uint)local_210;
        }
        local_274.bigend.vect[1] = local_110[uVar21 * 7 + 4];
        if ((int)local_1fc < (int)local_110[uVar21 * 7 + 4]) {
          local_274.bigend.vect[1] = local_1fc;
        }
        local_274.bigend.vect[2] = *(uint *)((long)&local_fc + uVar21 * 0x1c);
        if ((int)local_200 < local_274.bigend.vect[2]) {
          local_274.bigend.vect[2] = local_200;
        }
        local_274.btype.itype = (uint)local_2d0;
        if ((local_274.smallend.vect[2] <= local_274.bigend.vect[2] && (uint)local_2d0 < 8) &&
            (local_274.smallend.vect[1] <= local_274.bigend.vect[1] &&
            local_274.smallend.vect[0] <= local_274.bigend.vect[0])) {
          if (uVar21 < 4) {
            iVar20 = local_340.Lx * 2;
            iVar19 = iVar20;
            if (local_274.bigend.vect[0] < local_340.Lx / 2) {
              iVar19 = 0;
            }
            local_2f8.smallend.vect[0] = iVar19 + ~local_274.bigend.vect[0];
            iVar18 = local_340.Ly / 2;
            iVar19 = -iVar18;
            if (local_274.smallend.vect[1] < iVar18) {
              iVar19 = iVar18;
            }
            local_2f8.smallend.vect[1] = iVar19 + local_274.smallend.vect[1];
            if (local_274.smallend.vect[0] < local_340.Lx / 2) {
              iVar20 = 0;
            }
            local_2f8.bigend.vect[0] = iVar20 + ~local_274.smallend.vect[0];
            iVar20 = -iVar18;
            if (local_274.bigend.vect[1] < iVar18) {
              iVar20 = iVar18;
            }
            local_2f8.bigend.vect[1] = iVar20 + local_274.bigend.vect[1];
            local_2f8.btype.itype = 0;
            local_2f8.bigend.vect[2] = local_274.bigend.vect[2];
            local_2f8.smallend.vect[2] = local_274.smallend.vect[2];
          }
          else {
            NonLocalBC::PolarFn2::operator()(&local_2f8,&local_2b0,&local_274);
          }
          BoxArray::intersections(local_320,&local_2f8,&local_2a8);
          uVar22 = (uint)((ulong)((long)local_2a8.
                                        super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2a8.
                                       super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 5);
          uVar23 = local_204;
          if (0 < (int)uVar22) {
            uVar24 = (ulong)(uVar22 & 0x7fffffff);
            lVar25 = 4;
            do {
              iVar20 = *(int *)((long)((local_2a8.
                                        super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->second).smallend
                                      .vect + lVar25 + -8);
              piVar2 = (int *)((long)((local_2a8.
                                       super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->second).smallend.
                                     vect + lVar25 + -4);
              local_318.smallend.vect._0_8_ = *(undefined8 *)piVar2;
              puVar4 = (undefined8 *)
                       ((long)((local_2a8.
                                super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->second).smallend.vect +
                       lVar25 + 8);
              uVar12 = *puVar4;
              local_318._20_8_ = puVar4[1];
              local_318.smallend.vect[2] = (int)*(undefined8 *)(piVar2 + 2);
              local_318.bigend.vect[0] = (int)uVar12;
              local_318.bigend.vect[1] = (int)((ulong)uVar12 >> 0x20);
              if (local_318.smallend.vect[2] == (this->m_domain).smallend.vect[2]) {
                local_318.smallend.vect[2] = local_318.smallend.vect[2] - (this->m_ngrow).vect[2];
              }
              if (local_318.bigend.vect[2] == (this->m_domain).bigend.vect[2]) {
                local_318.btype.itype = (uint)((ulong)local_318._20_8_ >> 0x20);
                local_318.bigend.vect[2] = local_318.bigend.vect[2] + (this->m_ngrow).vect[2];
              }
              if (uVar21 < 4) {
                iVar19 = local_340.Lx * 2;
                iVar18 = iVar19;
                if (local_318.bigend.vect[0] < local_340.Lx / 2) {
                  iVar18 = 0;
                }
                local_290.smallend.vect[0] = iVar18 + ~local_318.bigend.vect[0];
                iVar16 = local_340.Ly / 2;
                iVar18 = -iVar16;
                if (local_318.smallend.vect[1] < iVar16) {
                  iVar18 = iVar16;
                }
                local_290.smallend.vect[1] = iVar18 + local_318.smallend.vect[1];
                if (local_318.smallend.vect[0] < local_340.Lx / 2) {
                  iVar19 = 0;
                }
                local_290.bigend.vect[0] = iVar19 + ~local_318.smallend.vect[0];
                local_290.bigend.vect[1] = -iVar16;
                if (local_318.bigend.vect[1] < iVar16) {
                  local_290.bigend.vect[1] = iVar16;
                }
                local_290.bigend.vect[1] = local_290.bigend.vect[1] + local_318.bigend.vect[1];
                local_290.smallend.vect[2] = local_318.smallend.vect[2];
                local_290.bigend.vect[2] = local_318.bigend.vect[2];
                local_290.btype.itype = 0;
              }
              else {
                NonLocalBC::PolarFn2::operator()(&local_290,&local_2b0,&local_318);
              }
              local_324 = *(int *)(*(long *)&(((local_2c0->distributionMap).m_ref.
                                               super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr)->m_pmap).
                                             super_vector<int,_std::allocator<int>_>.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                  (long)iVar20 * 4);
              local_258.dbox.bigend.vect[1] = local_290.bigend.vect[1];
              local_258.dbox.bigend.vect[2] = local_290.bigend.vect[2];
              local_258.dbox.btype.itype = local_290.btype.itype;
              local_258.dbox.smallend.vect[0] = local_290.smallend.vect[0];
              local_258.dbox.smallend.vect[1] = local_290.smallend.vect[1];
              local_258.dbox.smallend.vect[2] = local_290.smallend.vect[2];
              local_258.dbox.bigend.vect[0] = local_290.bigend.vect[0];
              local_258.sbox.bigend.vect[1] = local_318.bigend.vect[1];
              local_258.sbox.bigend.vect[2] = local_318.bigend.vect[2];
              local_258.sbox.btype.itype = local_318.btype.itype;
              local_258.sbox.smallend.vect[0] = local_318.smallend.vect[0];
              local_258.sbox.smallend.vect[1] = local_318.smallend.vect[1];
              local_258.sbox.smallend.vect[2] = local_318.smallend.vect[2];
              local_258.sbox.bigend.vect[0] = local_318.bigend.vect[0];
              local_258.dstIndex = iVar14;
              local_258.srcIndex = iVar20;
              if (local_324 == local_2b4) {
                this_01 = (vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>
                           *)(this->super_CommMetaData).m_LocTags._M_t.
                             super___uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                             .
                             super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
                             ._M_head_impl;
              }
              else {
                this_01 = (vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>
                           *)std::
                             map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                             ::operator[](pmVar6,&local_324);
              }
              iVar7._M_current = *(CopyComTag **)(this_01 + 8);
              if (iVar7._M_current == *(CopyComTag **)(this_01 + 0x10)) {
                std::
                vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>
                ::_M_realloc_insert<amrex::FabArrayBase::CopyComTag_const&>
                          (this_01,iVar7,&local_258);
              }
              else {
                *(undefined8 *)(((iVar7._M_current)->sbox).bigend.vect + 2) = local_258.sbox._20_8_;
                (iVar7._M_current)->dstIndex = local_258.dstIndex;
                (iVar7._M_current)->srcIndex = local_258.srcIndex;
                *(ulong *)(((iVar7._M_current)->sbox).smallend.vect + 1) =
                     CONCAT44(local_258.sbox.smallend.vect[2],local_258.sbox.smallend.vect[1]);
                *(ulong *)((iVar7._M_current)->sbox).bigend.vect =
                     CONCAT44(local_258.sbox.bigend.vect[1],local_258.sbox.bigend.vect[0]);
                *(ulong *)(((iVar7._M_current)->dbox).bigend.vect + 1) =
                     CONCAT44(local_258.dbox.bigend.vect[2],local_258.dbox.bigend.vect[1]);
                *(ulong *)&((iVar7._M_current)->dbox).btype =
                     CONCAT44(local_258.sbox.smallend.vect[0],local_258.dbox.btype.itype);
                *(undefined8 *)((iVar7._M_current)->dbox).smallend.vect =
                     local_258.dbox.smallend.vect._0_8_;
                *(ulong *)(((iVar7._M_current)->dbox).smallend.vect + 2) =
                     CONCAT44(local_258.dbox.bigend.vect[0],local_258.dbox.smallend.vect[2]);
                *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 0x40;
              }
              lVar25 = lVar25 + 0x20;
              uVar24 = uVar24 - 1;
              uVar23 = local_204;
            } while (uVar24 != 0);
          }
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 != 8);
      uVar21 = local_1f8 + 1;
    } while (uVar21 != local_338);
  }
  iVar14 = 0;
  do {
    lVar25 = *(long *)((this->m_ngrow).vect + (ulong)(iVar14 != 0) * 2 + -4);
    for (p_Var15 = *(_Rb_tree_node_base **)(lVar25 + 0x18);
        p_Var15 != (_Rb_tree_node_base *)(lVar25 + 8);
        p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
      p_Var8 = p_Var15[1]._M_parent;
      p_Var9 = p_Var15[1]._M_left;
      if (p_Var8 != p_Var9) {
        uVar21 = (long)p_Var9 - (long)p_Var8 >> 6;
        lVar10 = 0x3f;
        if (uVar21 != 0) {
          for (; uVar21 >> lVar10 == 0; lVar10 = lVar10 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<amrex::FabArrayBase::CopyComTag*,std::vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (p_Var8,p_Var9,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<amrex::FabArrayBase::CopyComTag*,std::vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (p_Var8,p_Var9);
      }
    }
    bVar26 = iVar14 == 0;
    iVar14 = iVar14 + 1;
  } while (bVar26);
  if (local_2a8.
      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8.
                    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a8.
                          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.
                          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
FabArrayBase::PolarB::define (const FabArrayBase& fa)
{
    const int myproc = ParallelDescriptor::MyProc();
    const BoxArray& ba = fa.boxArray();
    const DistributionMapping& dm = fa.DistributionMap();
    const Vector<int>& imap = fa.IndexArray();

    const int nlocal = imap.size();
    std::vector<std::pair<int,Box> > isects;

    const int ymid = m_domain.length(1) / 2;
    Box lox_box = amrex::adjCellLo(m_domain, 0, m_ngrow[0]);
    Box hix_box = amrex::adjCellHi(m_domain, 0, m_ngrow[0]);
#if (AMREX_SPACEDIM == 3)
    lox_box.grow(2, m_ngrow[2]);
    hix_box.grow(2, m_ngrow[2]);
#endif
    Box loxy_corner(IntVect{AMREX_D_DECL(-m_ngrow[0],-m_ngrow[1],-m_ngrow[2])},
                    IntVect{AMREX_D_DECL(-1,-1,m_domain.bigEnd(2)+m_ngrow[2])});
    Array<Box,8> const domain_dst{Box(lox_box).setBig  (1,ymid-1),
                                  Box(lox_box).setSmall(1,ymid  ),
                                  Box(hix_box).setBig  (1,ymid-1),
                                  Box(hix_box).setSmall(1,ymid  ),
                                  loxy_corner,
                                  amrex::shift(loxy_corner,1,m_domain.length(1)+m_ngrow[1]),
                                  amrex::shift(loxy_corner,0,m_domain.length(0)+m_ngrow[0]),
                                  amrex::shift(loxy_corner,
                                               IntVect{AMREX_D_DECL(m_domain.length(0)+m_ngrow[0],
                                                                    m_domain.length(1)+m_ngrow[1],
                                                                    0)})};

    auto const convert = NonLocalBC::PolarFn{m_domain.length(0), m_domain.length(1)};
    auto const convert_corner = NonLocalBC::PolarFn2{m_domain.length(0), m_domain.length(1)};

    Array<Box,8> const domain_src{convert(domain_dst[0]), convert(domain_dst[1]),
                                  convert(domain_dst[2]), convert(domain_dst[3]),
                                  convert_corner(domain_dst[4]), convert_corner(domain_dst[5]),
                                  convert_corner(domain_dst[6]), convert_corner(domain_dst[7])};

    auto& send_tags = *m_SndTags;

    for (int i = 0; i < nlocal; ++i)
    {
        const int ksnd = imap[i];
        Box gbx = ba[ksnd];
#if (AMREX_SPACEDIM == 3)
        if (gbx.smallEnd(2) == m_domain.smallEnd(2)) {
            gbx.growLo(2, m_ngrow[2]);
        }
        if (gbx.bigEnd(2) == m_domain.bigEnd(2)) {
            gbx.growHi(2, m_ngrow[2]);
        }
#endif

        for (int n = 0; n < 8; ++n) {
            Box const src_box = gbx & domain_src[n];
            if (src_box.ok()) {
                Box const dst_box = (n<4) ? convert(src_box) : convert_corner(src_box);
                ba.intersections(dst_box, isects, false, m_ngrow);
                for (int j = 0, M = isects.size(); j < M; ++j) {
                    const int krcv = isects[j].first;
                    const Box& bxrcv = isects[j].second;
                    const int dst_owner = dm[krcv];
                    if (dst_owner != myproc) // local copy will be dealt with later
                    {
                        Box const bxsnd = (n<4) ? convert(bxrcv) : convert_corner(bxrcv);
                        send_tags[dst_owner].push_back(FabArrayBase::CopyComTag(bxrcv, bxsnd,
                                                                                krcv, ksnd));
                    }
                }
            }
        }
    }

    auto& recv_tags = *m_RcvTags;

    for (int i = 0; i < nlocal; ++i)
    {
        const int krcv = imap[i];
        Box const& gbx = amrex::grow(ba[krcv],m_ngrow);

        for (int n = 0; n < 8; ++n) {
            Box const dst_box = gbx & domain_dst[n];
            if (dst_box.ok()) {
                Box const src_box = (n<4) ? convert(dst_box) : convert_corner(dst_box);
                ba.intersections(src_box, isects);
                for (int j = 0, M = isects.size(); j < M; ++j) {
                    const int ksnd = isects[j].first;
                    Box bxsnd = isects[j].second;
                    // the ghosts at lo-x and hi-z boundary are the source too
#if (AMREX_SPACEDIM == 3)
                    if (bxsnd.smallEnd(2) == m_domain.smallEnd(2)) {
                        bxsnd.growLo(2, m_ngrow[2]);
                    }
                    if (bxsnd.bigEnd(2) == m_domain.bigEnd(2)) {
                        bxsnd.growHi(2, m_ngrow[2]);
                    }
#endif
                    const Box bxrcv = (n<4) ? convert(bxsnd) : convert_corner(bxsnd);
                    const int src_owner = dm[ksnd];
                    FabArrayBase::CopyComTag cct(bxrcv, bxsnd, krcv, ksnd);
                    if (src_owner == myproc) {
                        m_LocTags->push_back(cct);
                    } else {
                        recv_tags[src_owner].push_back(cct);
                    }
                }
            }
        }
    }

    for (int ipass = 0; ipass < 2; ++ipass) // pass 0: send; pass 1: recv
    {
        auto& Tags = (ipass == 0) ? *m_SndTags : *m_RcvTags;
        for (auto& kv : Tags)
        {
            auto& cctv = kv.second;
            // We need to fix the order so that the send and recv processes match.
            std::sort(cctv.begin(), cctv.end());
        }
    }
}